

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>const&>
::
AnalyzeElements<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::const_iterator>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>const&>
          *this,const_iterator elem_first,const_iterator elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  pair<const_phmap::priv::hash_internal::EnumClass,_int> *extraout_RDX;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> *value;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> *extraout_RDX_00;
  long lVar1;
  size_t sVar2;
  long lVar3;
  pointer pcVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  DummyMatchResultListener dummy;
  allocator_type local_99;
  vector<char,_std::allocator<char>_> local_98;
  string local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  MatchResultListener *local_50;
  size_t local_48;
  MatchResultListener local_40;
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)element_printouts;
  local_50 = listener;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(element_printouts,
                    (element_printouts->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  sVar6 = 0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_003431e0;
  value = extraout_RDX;
  while ((elem_first.iter_.inner_ != elem_last.iter_.inner_ ||
         ((elem_first.iter_.inner_ != (Inner *)0x0 &&
          (elem_first.iter_.it_.ctrl_ != elem_last.iter_.it_.ctrl_))))) {
    local_48 = sVar6;
    if (local_50->stream_ != (ostream *)0x0) {
      PrintToString<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
                (&local_78,(testing *)elem_first.iter_.it_.field_1.slot_,value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    lVar3 = *(long *)(this + 0x28);
    if (*(long *)(this + 0x30) != lVar3) {
      lVar1 = 0;
      lVar5 = 0;
      do {
        local_78._M_dataplus._M_p._0_1_ =
             MatcherBase<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>::
             MatchAndExplain((MatcherBase<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>
                              *)(lVar3 + lVar1),
                             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)
                             elem_first.iter_.it_.field_1.slot_,&local_40);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_98,(char *)&local_78);
        lVar5 = lVar5 + 1;
        lVar3 = *(long *)(this + 0x28);
        lVar1 = lVar1 + 0x18;
      } while (lVar5 != (*(long *)(this + 0x30) - lVar3 >> 3) * -0x5555555555555555);
    }
    sVar6 = local_48 + 1;
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::iterator::operator++(&elem_first.iter_);
    value = extraout_RDX_00;
  }
  sVar2 = (*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 3) * -0x5555555555555555;
  __return_storage_ptr__->num_elements_ = sVar6;
  __return_storage_ptr__->num_matchers_ = sVar2;
  local_78._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            (&__return_storage_ptr__->matched_,sVar2 * sVar6,(value_type *)&local_78,&local_99);
  if (sVar6 != 0) {
    lVar1 = *(long *)(this + 0x28);
    lVar3 = *(long *)(this + 0x30);
    sVar2 = 0;
    pcVar4 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      bVar7 = lVar3 != lVar1;
      lVar3 = lVar1;
      if (bVar7) {
        lVar3 = 0;
        do {
          (__return_storage_ptr__->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl
          .super__Vector_impl_data._M_start[lVar3 + __return_storage_ptr__->num_matchers_ * sVar2] =
               pcVar4[lVar3] != '\0';
          lVar3 = lVar3 + 1;
          lVar1 = *(long *)(this + 0x28);
        } while (lVar3 != (*(long *)(this + 0x30) - lVar1 >> 3) * -0x5555555555555555);
        pcVar4 = pcVar4 + lVar3;
        lVar3 = *(long *)(this + 0x30);
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != sVar6);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }